

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::checkbox::checkbox(checkbox *this,string *type)

{
  string *this_00;
  void **in_RDI;
  base_widget *unaff_retaddr;
  string *in_stack_ffffffffffffffd0;
  base_html_input *in_stack_ffffffffffffffe0;
  
  base_widget::base_widget(unaff_retaddr);
  base_html_input::base_html_input(in_stack_ffffffffffffffe0,in_RDI,in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__checkbox_0052cc00;
  in_RDI[0xc] = &PTR_render_0052cc80;
  booster::hold_ptr<cppcms::widgets::checkbox::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::checkbox::_data> *)(in_RDI + 6));
  this_00 = (string *)(in_RDI + 7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_00,"y",(allocator *)&stack0xffffffffffffffe3);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
  *(undefined1 *)(in_RDI + 0xb) = 0;
  base_widget::set((base_widget *)((long)in_RDI + *(long *)((long)*in_RDI + -0x18)),true);
  return;
}

Assistant:

checkbox::checkbox(std::string const &type) : 
	base_html_input(type),
	identification_("y"),
	value_(false)
{
	set(true);	
}